

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int lzip_init(archive_read_filter *self)

{
  void *pvVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  int ret;
  int log2dic;
  uint32_t dicsize;
  ssize_t avail_in;
  undefined8 uStack_48;
  uchar props [5];
  lzma_filter filters [2];
  uchar *h;
  private_data_conflict1 *state;
  archive_read_filter *self_local;
  
  pvVar1 = self->data;
  pvVar4 = __archive_read_filter_ahead(self->upstream,6,(ssize_t *)&log2dic);
  if (pvVar4 == (void *)0x0) {
    self_local._4_4_ = -0x1e;
  }
  else {
    *(undefined1 *)((long)pvVar1 + 0xa2) = *(undefined1 *)((long)pvVar4 + 4);
    avail_in._3_1_ = 0x5d;
    bVar2 = *(byte *)((long)pvVar4 + 5) & 0x1f;
    if ((bVar2 < 0xc) || (0x1d < bVar2)) {
      self_local._4_4_ = -0x1e;
    }
    else {
      ret = 1 << bVar2;
      if (0xc < bVar2) {
        ret = ret - ((uint)ret >> 4) * ((int)(uint)*(byte *)((long)pvVar4 + 5) >> 5);
      }
      archive_le32enc((void *)((long)&avail_in + 4),ret);
      __archive_read_filter_consume(self->upstream,6);
      *(undefined8 *)((long)pvVar1 + 0xa8) = 6;
      uStack_48 = 0x4000000000000001;
      iVar3 = lzma_properties_decode(&stack0xffffffffffffffb8,0,(long)&avail_in + 3,5);
      if (iVar3 == 0) {
        iVar3 = lzma_raw_decoder(pvVar1,&stack0xffffffffffffffb8);
        free((void *)0x0);
        if (iVar3 == 0) {
          self_local._4_4_ = 0;
        }
        else {
          set_error(self,iVar3);
          self_local._4_4_ = -0x1e;
        }
      }
      else {
        set_error(self,iVar3);
        self_local._4_4_ = -0x1e;
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
lzip_init(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *h;
	lzma_filter filters[2];
	unsigned char props[5];
	ssize_t avail_in;
	uint32_t dicsize;
	int log2dic, ret;

	state = (struct private_data *)self->data;
	h = __archive_read_filter_ahead(self->upstream, 6, &avail_in);
	if (h == NULL)
		return (ARCHIVE_FATAL);

	/* Get a version number. */
	state->lzip_ver = h[4];

	/*
	 * Setup lzma property.
	 */
	props[0] = 0x5d;

	/* Get dictionary size. */
	log2dic = h[5] & 0x1f;
	if (log2dic < 12 || log2dic > 29)
		return (ARCHIVE_FATAL);
	dicsize = 1U << log2dic;
	if (log2dic > 12)
		dicsize -= (dicsize / 16) * (h[5] >> 5);
	archive_le32enc(props+1, dicsize);

	/* Consume lzip header. */
	__archive_read_filter_consume(self->upstream, 6);
	state->member_in = 6;

	filters[0].id = LZMA_FILTER_LZMA1;
	filters[0].options = NULL;
	filters[1].id = LZMA_VLI_UNKNOWN;
	filters[1].options = NULL;

	ret = lzma_properties_decode(&filters[0], NULL, props, sizeof(props));
	if (ret != LZMA_OK) {
		set_error(self, ret);
		return (ARCHIVE_FATAL);
	}
	ret = lzma_raw_decoder(&(state->stream), filters);
	free(filters[0].options);
	if (ret != LZMA_OK) {
		set_error(self, ret);
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}